

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

int test_mp_check_error(void)

{
  mp_check_on_error_f p_Var1;
  mp_check_ext_data_f p_Var2;
  int iVar3;
  char *p;
  
  _plan(0xee,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_mp_check_error");
  p_Var2 = mp_check_ext_data;
  p_Var1 = mp_check_on_error;
  mp_check_ext_data = mp_check_ext_data_test;
  mp_check_on_error = mp_check_on_error_test;
  p = anon_var_dwarf_10ff + 0x12;
  iVar3 = mp_check(&p,anon_var_dwarf_10ff + 0x12);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6a8,
      "empty");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6a8,
      "empty - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_10ff + 0x12),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6a8,
      "empty - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_10ff + 0x12),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6a8,
      "empty - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6a8,
      "empty - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6a8,"empty - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6a8,"empty - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6a8,"empty - error ext len");
  }
  p = anon_var_dwarf_7a86;
  iVar3 = mp_check(&p,anon_var_dwarf_7a86 + 1);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6aa,
      "trunc fixstr");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6aa,
      "trunc fixstr - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_7a86),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6aa,
      "trunc fixstr - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_7a86 + 1),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6aa,
      "trunc fixstr - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6aa,
      "trunc fixstr - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6aa,"trunc fixstr - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6aa,"trunc fixstr - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6aa,"trunc fixstr - error ext len");
  }
  p = anon_var_dwarf_a9f;
  iVar3 = mp_check(&p,anon_var_dwarf_a9f + 1);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ab,
      "trunc str8 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ab,
      "trunc str8 header - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_a9f),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ab,
      "trunc str8 header - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_a9f + 1),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ab,
      "trunc str8 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ab,
      "trunc str8 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ab,"trunc str8 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ab,"trunc str8 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ab,"trunc str8 header - error ext len");
  }
  p = anon_var_dwarf_7b52;
  iVar3 = mp_check(&p,anon_var_dwarf_7b52 + 2);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ac,
      "trunc str8 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ac,
      "trunc str8 data - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_7b52),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ac,
      "trunc str8 data - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_7b52 + 2),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ac,
      "trunc str8 data - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ac,
      "trunc str8 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ac,"trunc str8 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ac,"trunc str8 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ac,"trunc str8 data - error ext len");
  }
  p = anon_var_dwarf_7bbe;
  iVar3 = mp_check(&p,anon_var_dwarf_7bbe + 2);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ad,
      "trunc str16 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ad,
      "trunc str16 header - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_7bbe),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ad,
      "trunc str16 header - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_7bbe + 2),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ad,
      "trunc str16 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ad,
      "trunc str16 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ad,"trunc str16 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ad,"trunc str16 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ad,"trunc str16 header - error ext len");
  }
  p = anon_var_dwarf_7c2a;
  iVar3 = mp_check(&p,anon_var_dwarf_7c2a + 3);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ae,
      "trunc str16 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ae,
      "trunc str16 data - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_7c2a),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ae,
      "trunc str16 data - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_7c2a + 3),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ae,
      "trunc str16 data - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ae,
      "trunc str16 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ae,"trunc str16 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ae,"trunc str16 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ae,"trunc str16 data - error ext len");
  }
  p = anon_var_dwarf_7c96;
  iVar3 = mp_check(&p,anon_var_dwarf_7c96 + 4);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6af,
      "trunc str32 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6af,
      "trunc str32 header - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_7c96),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6af,
      "trunc str32 header - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_7c96 + 4),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6af,
      "trunc str32 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6af,
      "trunc str32 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6af,"trunc str32 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6af,"trunc str32 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6af,"trunc str32 header - error ext len");
  }
  p = anon_var_dwarf_7d02;
  iVar3 = mp_check(&p,anon_var_dwarf_7d02 + 5);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b0,
      "trunc str32 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b0,
      "trunc str32 data - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_7d02),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b0,
      "trunc str32 data - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_7d02 + 5),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b0,
      "trunc str32 data - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b0,
      "trunc str32 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b0,"trunc str32 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b0,"trunc str32 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b0,"trunc str32 data - error ext len");
  }
  p = anon_var_dwarf_861a + 3;
  iVar3 = mp_check(&p,anon_var_dwarf_861a + 4);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b2,
      "trunc fixarray");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b2,
      "trunc fixarray - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_861a + 3),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b2,
      "trunc fixarray - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_861a + 4),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b2,
      "trunc fixarray - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 1),
      "last_error.pos - last_error.data == (ptrdiff_t)1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b2,
      "trunc fixarray - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 2),"last_error.trunc_count == 2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b2,"trunc fixarray - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b2,"trunc fixarray - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b2,"trunc fixarray - error ext len");
  }
  p = anon_var_dwarf_7de6;
  iVar3 = mp_check(&p,anon_var_dwarf_7de6 + 2);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b3,
      "trunc array16 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b3,
      "trunc array16 header - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_7de6),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b3,
      "trunc array16 header - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_7de6 + 2),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b3,
      "trunc array16 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b3,
      "trunc array16 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b3,"trunc array16 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b3,"trunc array16 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b3,"trunc array16 header - error ext len");
  }
  p = anon_var_dwarf_6a72;
  iVar3 = mp_check(&p,anon_var_dwarf_6a72 + 3);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b4,
      "trunc array16 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b4,
      "trunc array16 data - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_6a72),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b4,
      "trunc array16 data - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_6a72 + 3),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b4,
      "trunc array16 data - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 3),
      "last_error.pos - last_error.data == (ptrdiff_t)3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b4,
      "trunc array16 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0x10),"last_error.trunc_count == 16",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b4,"trunc array16 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b4,"trunc array16 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b4,"trunc array16 data - error ext len");
  }
  p = anon_var_dwarf_7eca;
  iVar3 = mp_check(&p,anon_var_dwarf_7eca + 4);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b5,
      "trunc array32 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b5,
      "trunc array32 header - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_7eca),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b5,
      "trunc array32 header - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_7eca + 4),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b5,
      "trunc array32 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b5,
      "trunc array32 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b5,"trunc array32 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b5,"trunc array32 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b5,"trunc array32 header - error ext len");
  }
  p = anon_var_dwarf_7f36;
  iVar3 = mp_check(&p,anon_var_dwarf_7f36 + 5);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b6,
      "trunc array32 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b6,
      "trunc array32 data - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_7f36),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b6,
      "trunc array32 data - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_7f36 + 5),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b6,
      "trunc array32 data - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 5),
      "last_error.pos - last_error.data == (ptrdiff_t)5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b6,
      "trunc array32 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0x10),"last_error.trunc_count == 16",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b6,"trunc array32 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b6,"trunc array32 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b6,"trunc array32 data - error ext len");
  }
  p = anon_var_dwarf_8692 + 4;
  iVar3 = mp_check(&p,anon_var_dwarf_8692 + 5);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b8,
      "trunc fixmap");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b8,
      "trunc fixmap - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_8692 + 4),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b8,
      "trunc fixmap - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_8692 + 5),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b8,
      "trunc fixmap - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 1),
      "last_error.pos - last_error.data == (ptrdiff_t)1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b8,
      "trunc fixmap - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 4),"last_error.trunc_count == 4",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b8,"trunc fixmap - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b8,"trunc fixmap - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b8,"trunc fixmap - error ext len");
  }
  p = anon_var_dwarf_8026;
  iVar3 = mp_check(&p,anon_var_dwarf_8026 + 2);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b9,
      "trunc map16 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b9,
      "trunc map16 header - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_8026),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b9,
      "trunc map16 header - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_8026 + 2),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b9,
      "trunc map16 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b9,
      "trunc map16 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b9,"trunc map16 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b9,"trunc map16 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b9,"trunc map16 header - error ext len");
  }
  p = anon_var_dwarf_6f76;
  iVar3 = mp_check(&p,anon_var_dwarf_6f76 + 3);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ba,
      "trunc map16 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ba,
      "trunc map16 data - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_6f76),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ba,
      "trunc map16 data - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_6f76 + 3),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ba,
      "trunc map16 data - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 3),
      "last_error.pos - last_error.data == (ptrdiff_t)3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ba,
      "trunc map16 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0x20),"last_error.trunc_count == 32",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ba,"trunc map16 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ba,"trunc map16 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ba,"trunc map16 data - error ext len");
  }
  p = anon_var_dwarf_80fe;
  iVar3 = mp_check(&p,anon_var_dwarf_80fe + 4);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bb,
      "trunc map32 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bb,
      "trunc map32 header - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_80fe),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bb,
      "trunc map32 header - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_80fe + 4),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bb,
      "trunc map32 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bb,
      "trunc map32 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bb,"trunc map32 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bb,"trunc map32 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bb,"trunc map32 header - error ext len");
  }
  p = anon_var_dwarf_816a;
  iVar3 = mp_check(&p,anon_var_dwarf_816a + 5);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bc,
      "trunc map32 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bc,
      "trunc map32 data - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_816a),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bc,
      "trunc map32 data - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_816a + 5),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bc,
      "trunc map32 data - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 5),
      "last_error.pos - last_error.data == (ptrdiff_t)5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bc,
      "trunc map32 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0x20),"last_error.trunc_count == 32",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bc,"trunc map32 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bc,"trunc map32 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bc,"trunc map32 data - error ext len");
  }
  p = anon_var_dwarf_91f;
  iVar3 = mp_check(&p,anon_var_dwarf_91f + 1);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6be,
      "trunc fixext header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6be,
      "trunc fixext header - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_91f),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6be,
      "trunc fixext header - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_91f + 1),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6be,
      "trunc fixext header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6be,
      "trunc fixext header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6be,"trunc fixext header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6be,"trunc fixext header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6be,"trunc fixext header - error ext len");
  }
  p = anon_var_dwarf_8236;
  iVar3 = mp_check(&p,anon_var_dwarf_8236 + 2);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bf,
      "trunc fixext data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bf,
      "trunc fixext data - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_8236),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bf,
      "trunc fixext data - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_8236 + 2),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bf,
      "trunc fixext data - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bf,
      "trunc fixext data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bf,"trunc fixext data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bf,"trunc fixext data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bf,"trunc fixext data - error ext len");
  }
  p = anon_var_dwarf_82a2;
  iVar3 = mp_check(&p,anon_var_dwarf_82a2 + 2);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c0,
      "trunc ext8 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c0,
      "trunc ext8 header - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_82a2),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c0,
      "trunc ext8 header - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_82a2 + 2),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c0,
      "trunc ext8 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c0,
      "trunc ext8 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c0,"trunc ext8 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c0,"trunc ext8 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c0,"trunc ext8 header - error ext len");
  }
  p = anon_var_dwarf_830e;
  iVar3 = mp_check(&p,anon_var_dwarf_830e + 3);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c1,
      "trunc ext8 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c1,
      "trunc ext8 data - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_830e),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c1,
      "trunc ext8 data - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_830e + 3),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c1,
      "trunc ext8 data - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c1,
      "trunc ext8 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c1,"trunc ext8 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c1,"trunc ext8 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c1,"trunc ext8 data - error ext len");
  }
  p = anon_var_dwarf_837a;
  iVar3 = mp_check(&p,anon_var_dwarf_837a + 3);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c2,
      "trunc ext16 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c2,
      "trunc ext16 header - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_837a),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c2,
      "trunc ext16 header - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_837a + 3),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c2,
      "trunc ext16 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c2,
      "trunc ext16 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c2,"trunc ext16 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c2,"trunc ext16 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c2,"trunc ext16 header - error ext len");
  }
  p = anon_var_dwarf_83e6;
  iVar3 = mp_check(&p,anon_var_dwarf_83e6 + 4);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c3,
      "trunc ext16 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c3,
      "trunc ext16 data - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_83e6),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c3,
      "trunc ext16 data - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_83e6 + 4),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c3,
      "trunc ext16 data - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c3,
      "trunc ext16 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c3,"trunc ext16 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c3,"trunc ext16 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c3,"trunc ext16 data - error ext len");
  }
  p = anon_var_dwarf_8452;
  iVar3 = mp_check(&p,anon_var_dwarf_8452 + 5);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c4,
      "trunc ext32 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c4,
      "trunc ext32 header - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_8452),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c4,
      "trunc ext32 header - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_8452 + 5),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c4,
      "trunc ext32 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c4,
      "trunc ext32 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c4,"trunc ext32 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c4,"trunc ext32 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c4,"trunc ext32 header - error ext len");
  }
  p = anon_var_dwarf_84be;
  iVar3 = mp_check(&p,anon_var_dwarf_84be + 6);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c5,
      "trunc ext32 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c5,
      "trunc ext32 data - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_84be),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c5,
      "trunc ext32 data - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_84be + 6),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c5,
      "trunc ext32 data - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c5,
      "trunc ext32 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c5,"trunc ext32 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c5,"trunc ext32 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c5,"trunc ext32 data - error ext len");
  }
  p = anon_var_dwarf_8692 + 3;
  iVar3 = mp_check(&p,anon_var_dwarf_8692 + 5);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c7,
      "trunc nested 1");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c7,
      "trunc nested 1 - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_8692 + 3),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c7,
      "trunc nested 1 - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_8692 + 5),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c7,
      "trunc nested 1 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 2),
      "last_error.pos - last_error.data == (ptrdiff_t)2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c7,
      "trunc nested 1 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 5),"last_error.trunc_count == 5",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c7,"trunc nested 1 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c7,"trunc nested 1 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c7,"trunc nested 1 - error ext len");
  }
  p = anon_var_dwarf_85ae;
  iVar3 = mp_check(&p,anon_var_dwarf_85ae + 3);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c8,
      "trunc nested 2");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c8,
      "trunc nested 2 - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_85ae),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c8,
      "trunc nested 2 - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_85ae + 3),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c8,
      "trunc nested 2 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 3),
      "last_error.pos - last_error.data == (ptrdiff_t)3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c8,
      "trunc nested 2 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 4),"last_error.trunc_count == 4",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c8,"trunc nested 2 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c8,"trunc nested 2 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c8,"trunc nested 2 - error ext len");
  }
  p = anon_var_dwarf_861a;
  iVar3 = mp_check(&p,anon_var_dwarf_861a + 4);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c9,
      "trunc nested 3");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c9,
      "trunc nested 3 - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_861a),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c9,
      "trunc nested 3 - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_861a + 4),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c9,
      "trunc nested 3 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 4),
      "last_error.pos - last_error.data == (ptrdiff_t)4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c9,
      "trunc nested 3 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 5),"last_error.trunc_count == 5",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c9,"trunc nested 3 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c9,"trunc nested 3 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c9,"trunc nested 3 - error ext len");
  }
  p = anon_var_dwarf_8692;
  iVar3 = mp_check(&p,anon_var_dwarf_8692 + 5);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ca,
      "trunc nested 4");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ca,
      "trunc nested 4 - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_8692),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ca,
      "trunc nested 4 - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_8692 + 5),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ca,
      "trunc nested 4 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 5),
      "last_error.pos - last_error.data == (ptrdiff_t)5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ca,
      "trunc nested 4 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 8),"last_error.trunc_count == 8",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ca,"trunc nested 4 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ca,"trunc nested 4 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ca,"trunc nested 4 - error ext len");
  }
  p = anon_var_dwarf_8a9a + 2;
  iVar3 = mp_check(&p,anon_var_dwarf_8a9a + 3);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cc,
      "ill 1");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_ILL),"last_error.type == MP_CHECK_ERROR_ILL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cc,
      "ill 1 - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_8a9a + 2),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cc,
      "ill 1 - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_8a9a + 3),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cc,
      "ill 1 - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cc,
      "ill 1 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6cc,"ill 1 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6cc,"ill 1 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6cc,"ill 1 - error ext len");
  }
  p = anon_var_dwarf_8782;
  iVar3 = mp_check(&p,anon_var_dwarf_8782 + 2);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cd,
      "ill 2");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_ILL),"last_error.type == MP_CHECK_ERROR_ILL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cd,
      "ill 2 - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_8782),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cd,
      "ill 2 - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_8782 + 2),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cd,
      "ill 2 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 1),
      "last_error.pos - last_error.data == (ptrdiff_t)1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cd,
      "ill 2 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6cd,"ill 2 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6cd,"ill 2 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6cd,"ill 2 - error ext len");
  }
  p = anon_var_dwarf_7846;
  iVar3 = mp_check(&p,anon_var_dwarf_7846 + 3);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ce,
      "ill 3");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_ILL),"last_error.type == MP_CHECK_ERROR_ILL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ce,
      "ill 3 - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_7846),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ce,
      "ill 3 - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_7846 + 3),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ce,
      "ill 3 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 2),
      "last_error.pos - last_error.data == (ptrdiff_t)2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ce,
      "ill 3 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ce,"ill 3 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ce,"ill 3 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ce,"ill 3 - error ext len");
  }
  p = anon_var_dwarf_884e;
  iVar3 = mp_check(&p,anon_var_dwarf_884e + 3);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d0,
      "bad fixext");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_EXT),"last_error.type == MP_CHECK_ERROR_EXT",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d0,
      "bad fixext - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_884e),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d0,
      "bad fixext - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_884e + 3),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d0,
      "bad fixext - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 2),
      "last_error.pos - last_error.data == (ptrdiff_t)2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d0,
      "bad fixext - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d0,"bad fixext - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == 'B'),"last_error.ext_type == 0x42",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d0,"bad fixext - error ext type");
    _ok((uint)(last_error.ext_len == 1),"last_error.ext_len == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d0,"bad fixext - error ext len");
  }
  p = anon_var_dwarf_88de;
  iVar3 = mp_check(&p,anon_var_dwarf_88de + 4);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d1,
      "bad ext8");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_EXT),"last_error.type == MP_CHECK_ERROR_EXT",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d1,
      "bad ext8 - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_88de),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d1,
      "bad ext8 - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_88de + 4),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d1,
      "bad ext8 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 3),
      "last_error.pos - last_error.data == (ptrdiff_t)3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d1,
      "bad ext8 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d1,"bad ext8 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == 'B'),"last_error.ext_type == 0x42",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d1,"bad ext8 - error ext type");
    _ok((uint)(last_error.ext_len == 1),"last_error.ext_len == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d1,"bad ext8 - error ext len");
  }
  p = anon_var_dwarf_894a;
  iVar3 = mp_check(&p,anon_var_dwarf_894a + 5);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d2,
      "bad ext16");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_EXT),"last_error.type == MP_CHECK_ERROR_EXT",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d2,
      "bad ext16 - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_894a),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d2,
      "bad ext16 - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_894a + 5),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d2,
      "bad ext16 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 4),
      "last_error.pos - last_error.data == (ptrdiff_t)4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d2,
      "bad ext16 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d2,"bad ext16 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == 'B'),"last_error.ext_type == 0x42",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d2,"bad ext16 - error ext type");
    _ok((uint)(last_error.ext_len == 1),"last_error.ext_len == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d2,"bad ext16 - error ext len");
  }
  p = anon_var_dwarf_89b6;
  iVar3 = mp_check(&p,anon_var_dwarf_89b6 + 7);
  _ok((uint)(iVar3 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d3,
      "bad ext32");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_EXT),"last_error.type == MP_CHECK_ERROR_EXT",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d3,
      "bad ext32 - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_89b6),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d3,
      "bad ext32 - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_89b6 + 7),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d3,
      "bad ext32 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 6),
      "last_error.pos - last_error.data == (ptrdiff_t)6",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d3,
      "bad ext32 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d3,"bad ext32 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == 'B'),"last_error.ext_type == 0x42",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d3,"bad ext32 - error ext type");
    _ok((uint)(last_error.ext_len == 1),"last_error.ext_len == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d3,"bad ext32 - error ext len");
  }
  p = anon_var_dwarf_792a + 3;
  iVar3 = mp_check_exact(&p,anon_var_dwarf_792a + 5);
  _ok((uint)(iVar3 != 0),"mp_check_exact(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d5,
      "junk 1");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_JUNK),"last_error.type == MP_CHECK_ERROR_JUNK",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d5,
      "junk 1 - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_792a + 3),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d5,
      "junk 1 - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_792a + 5),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d5,
      "junk 1 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 1),
      "last_error.pos - last_error.data == (ptrdiff_t)1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d5,
      "junk 1 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d5,"junk 1 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d5,"junk 1 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d5,"junk 1 - error ext len");
  }
  p = anon_var_dwarf_8a9a;
  iVar3 = mp_check_exact(&p,anon_var_dwarf_8a9a + 3);
  _ok((uint)(iVar3 != 0),"mp_check_exact(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d6,
      "junk 2");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_JUNK),"last_error.type == MP_CHECK_ERROR_JUNK",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d6,
      "junk 2 - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_8a9a),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d6,
      "junk 2 - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_8a9a + 3),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d6,
      "junk 2 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 1),
      "last_error.pos - last_error.data == (ptrdiff_t)1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d6,
      "junk 2 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d6,"junk 2 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d6,"junk 2 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d6,"junk 2 - error ext len");
  }
  p = anon_var_dwarf_78fa;
  iVar3 = mp_check_exact(&p,anon_var_dwarf_78fa + 4);
  _ok((uint)(iVar3 != 0),"mp_check_exact(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d7,
      "junk 3");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_JUNK),"last_error.type == MP_CHECK_ERROR_JUNK",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d7,
      "junk 3 - error type");
  _ok((uint)(last_error.data == anon_var_dwarf_78fa),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d7,
      "junk 3 - error data");
  _ok((uint)(last_error.end == anon_var_dwarf_78fa + 4),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d7,
      "junk 3 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 3),
      "last_error.pos - last_error.data == (ptrdiff_t)3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d7,
      "junk 3 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d7,"junk 3 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d7,"junk 3 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d7,"junk 3 - error ext len");
  }
  mp_check_on_error = p_Var1;
  mp_check_ext_data = p_Var2;
  _space(_stdout);
  printf("# *** %s: done ***\n","test_mp_check_error");
  iVar3 = check_plan();
  return iVar3;
}

Assistant:

static int
test_mp_check_error(void)
{
	const int trunc_error_count = 30;
	const int ill_error_count = 3;
	const int ext_error_count = 4;
	const int junk_error_count = 3;
	plan(6 * trunc_error_count +
	     5 * ill_error_count +
	     7 * ext_error_count +
	     5 * junk_error_count);
	header();

	mp_check_ext_data_f mp_check_ext_data_svp = mp_check_ext_data;
	mp_check_ext_data = mp_check_ext_data_test;
	mp_check_on_error_f mp_check_on_error_svp = mp_check_on_error;
	mp_check_on_error = mp_check_on_error_test;

#define check_error(check_, data_, offset_, type_, trunc_count_,	\
		    ext_type_, ext_len_, msg_)				\
	do {			\
		const char *data = data_;				\
		const char *end = data + sizeof(data_) - 1;		\
		const char *p = data;					\
		isnt(check_(&p, end), 0, msg_);				\
		is(last_error.type, type_, msg_ " - error type");	\
		is(last_error.data, data, msg_ " - error data");	\
		is(last_error.end, end, msg_ " - error data end");	\
		is(last_error.pos - last_error.data, (ptrdiff_t)offset_,\
		   msg_ " - error data pos");				\
		if (last_error.type == MP_CHECK_ERROR_TRUNC) {		\
			is(last_error.trunc_count, trunc_count_,	\
			   msg_ " - error trunc count");		\
		}							\
		if (last_error.type == MP_CHECK_ERROR_EXT) {		\
			is(last_error.ext_type, ext_type_,		\
			   msg_ " - error ext type");			\
			is(last_error.ext_len, ext_len_,		\
			   msg_ " - error ext len");			\
		}							\
	} while (0)

#define check_error_trunc(data_, offset_, trunc_count_, msg_)		\
	check_error(mp_check, data_, offset_, MP_CHECK_ERROR_TRUNC,	\
		    trunc_count_, 0, 0, msg_)

#define check_error_ill(data_, offset_, msg_)				\
	check_error(mp_check, data_, offset_, MP_CHECK_ERROR_ILL,	\
		    0, 0, 0, msg_)

#define check_error_ext(data_, offset_, ext_type_, ext_len_, msg_)	\
	check_error(mp_check, data_, offset_, MP_CHECK_ERROR_EXT,	\
		    0, ext_type_, ext_len_, msg_)

#define check_error_junk(data_, offset_, msg_)				\
	check_error(mp_check_exact, data_, offset_, MP_CHECK_ERROR_JUNK,\
		    0, 0, 0, msg_)

	check_error_trunc("", 0, 1, "empty");

	check_error_trunc("\xa2", 0, 1, "trunc fixstr");
	check_error_trunc("\xd9", 0, 1, "trunc str8 header");
	check_error_trunc("\xd9\x10", 0, 1, "trunc str8 data");
	check_error_trunc("\xda\x00", 0, 1, "trunc str16 header");
	check_error_trunc("\xda\x00\x10", 0, 1, "trunc str16 data");
	check_error_trunc("\xdb\x00\x00\x00", 0, 1, "trunc str32 header");
	check_error_trunc("\xdb\x00\x00\x00\x10", 0, 1, "trunc str32 data");

	check_error_trunc("\x92", 1, 2, "trunc fixarray");
	check_error_trunc("\xdc\x00", 0, 1, "trunc array16 header");
	check_error_trunc("\xdc\x00\x10", 3, 16, "trunc array16 data");
	check_error_trunc("\xdd\x00\x00\x00", 0, 1, "trunc array32 header");
	check_error_trunc("\xdd\x00\x00\x00\x10", 5, 16, "trunc array32 data");

	check_error_trunc("\x82", 1, 4, "trunc fixmap");
	check_error_trunc("\xde\x00", 0, 1, "trunc map16 header");
	check_error_trunc("\xde\x00\x10", 3, 32, "trunc map16 data");
	check_error_trunc("\xdf\x00\x00\x00", 0, 1, "trunc map32 header");
	check_error_trunc("\xdf\x00\x00\x00\x10", 5, 32, "trunc map32 data");

	check_error_trunc("\xd4", 0, 1, "trunc fixext header");
	check_error_trunc("\xd4\x42", 0, 1, "trunc fixext data");
	check_error_trunc("\xc7\x10", 0, 1, "trunc ext8 header");
	check_error_trunc("\xc7\x10\x42", 0, 1, "trunc ext8 data");
	check_error_trunc("\xc8\x00\x10", 0, 1, "trunc ext16 header");
	check_error_trunc("\xc8\x00\x10\x42", 0, 1, "trunc ext16 data");
	check_error_trunc("\xc9\x00\x00\x00\x10", 0, 1, "trunc ext32 header");
	check_error_trunc("\xc9\x00\x00\x00\x10\x42", 0, 1, "trunc ext32 data");

	check_error_trunc("\x92\x82", 2, 5, "trunc nested 1");
	check_error_trunc("\x92\x82\xc0", 3, 4, "trunc nested 2");
	check_error_trunc("\x92\x82\xc0\x92", 4, 5, "trunc nested 3");
	check_error_trunc("\x92\x82\xc0\x92\x82", 5, 8, "trunc nested 4");

	check_error_ill("\xc1", 0, "ill 1");
	check_error_ill("\x92\xc1", 1, "ill 2");
	check_error_ill("\x92\xc0\xc1", 2, "ill 3");

	check_error_ext("\xd4\x42\x00", 2, 0x42, 1, "bad fixext");
	check_error_ext("\xc7\x01\x42\x00", 3, 0x42, 1, "bad ext8");
	check_error_ext("\xc8\x00\x01\x42\x00", 4, 0x42, 1, "bad ext16");
	check_error_ext("\xc9\x00\x00\x00\x01\x42\x00", 6, 0x42, 1, "bad ext32");

	check_error_junk("\xc0\xc0", 1, "junk 1");
	check_error_junk("\xc0\x91\xc1", 1, "junk 2");
	check_error_junk("\x92\xc0\xc0\xc0", 3, "junk 3");

#undef check_error_junk
#undef check_error_ext
#undef check_error_ill
#undef check_error_trunc
#undef check_error

	mp_check_ext_data = mp_check_ext_data_svp;
	mp_check_on_error = mp_check_on_error_svp;

	footer();
	return check_plan();
}